

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O2

void __thiscall
nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::color3f>>::
initialize<tinyusdz::Animatable<tinyusdz::value::color3f>>
          (optional<tinyusdz::Animatable<tinyusdz::value::color3f>> *this,
          Animatable<tinyusdz::value::color3f> *value)

{
  if (*this != (optional<tinyusdz::Animatable<tinyusdz::value::color3f>>)0x1) {
    tinyusdz::Animatable<tinyusdz::value::color3f>::Animatable
              ((Animatable<tinyusdz::value::color3f> *)(this + 8),value);
    *this = (optional<tinyusdz::Animatable<tinyusdz::value::color3f>>)0x1;
    return;
  }
  __assert_fail("! has_value()",
                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                ,0x5dd,
                "void nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::color3f>>::initialize(V &&) [T = tinyusdz::Animatable<tinyusdz::value::color3f>, V = tinyusdz::Animatable<tinyusdz::value::color3f>]"
               );
}

Assistant:

void initialize( V && value )
    {
        assert( ! has_value()  );
        contained.construct_value( std::move( value ) );
        has_value_ = true;
    }